

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall
TPZTensor<double>::Eigenvalue
          (TPZTensor<double> *this,TPZTensor<double> *eigenval,TPZTensor<double> *dSigma1,
          TPZTensor<double> *dSigma2,TPZTensor<double> *dSigma3)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  _func_int **pp_Var8;
  TPZTensor<double> *pTVar9;
  long lVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  double dVar13;
  double Lode;
  TPZTensor<double> dJ2;
  TPZTensor<double> dLode;
  TPZTensor<double> dJ3;
  TPZTensor<double> dLodeAngleTemp;
  double local_268;
  TPZTensor<double> *local_260;
  double local_258;
  ulong uStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  TPZTensor<double> *local_210;
  undefined1 local_208 [16];
  TPZTensor<double> local_1f8;
  _func_int **local_1a0;
  TPZVec<double> local_198;
  _func_int **local_178 [6];
  TPZTensor<double> local_148;
  TPZTensor<double> local_f0;
  double local_98;
  ulong uStack_90;
  TPZTensor<double> local_88;
  
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  local_258 = *pdVar1 + pdVar1[3] + pdVar1[5];
  local_260 = eigenval;
  local_210 = dSigma3;
  dVar7 = J2(this);
  uStack_90 = ~(CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff) &
              CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  local_98 = (double)(~-(ulong)(ABS(dVar7) < 1e-06) & (ulong)dVar7 |
                     -(ulong)(ABS(dVar7) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
  if (local_98 < 0.0) {
    dVar7 = sqrt(local_98);
    uVar11 = extraout_XMM0_Dc_00;
    uVar12 = extraout_XMM0_Dd_00;
  }
  else {
    uVar11 = 0;
    uVar12 = 0;
    dVar7 = SQRT(local_98);
  }
  local_208._8_4_ = uVar11;
  local_208._0_8_ = dVar7;
  local_208._12_4_ = uVar12;
  local_1f8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
  TPZVec<double>::TPZVec(&local_1f8.fData.super_TPZVec<double>,0);
  local_1f8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01877af0;
  local_1f8.fData.super_TPZVec<double>.fStore = local_1f8.fData.fExtAlloc;
  local_1f8.fData.super_TPZVec<double>.fNElements = 6;
  local_1f8.fData.super_TPZVec<double>.fNAlloc = 0;
  local_1f8.fData.fExtAlloc[0] = 0.0;
  local_1f8.fData.fExtAlloc[1] = 0.0;
  local_1f8.fData.fExtAlloc[2] = 0.0;
  local_1f8.fData.fExtAlloc[3] = 0.0;
  local_1f8.fData.fExtAlloc[4] = 0.0;
  local_1f8.fData.fExtAlloc[5] = 0.0;
  local_f0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
  TPZVec<double>::TPZVec(&local_f0.fData.super_TPZVec<double>,0);
  local_f0.fData.super_TPZVec<double>.fStore = local_f0.fData.fExtAlloc;
  local_f0.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01877af0;
  local_f0.fData.super_TPZVec<double>.fNElements = 6;
  local_f0.fData.super_TPZVec<double>.fNAlloc = 0;
  local_f0.fData.fExtAlloc[0] = 0.0;
  local_f0.fData.fExtAlloc[1] = 0.0;
  local_f0.fData.fExtAlloc[2] = 0.0;
  local_f0.fData.fExtAlloc[3] = 0.0;
  local_f0.fData.fExtAlloc[4] = 0.0;
  local_f0.fData.fExtAlloc[5] = 0.0;
  local_148.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
  TPZVec<double>::TPZVec(&local_148.fData.super_TPZVec<double>,0);
  local_148.fData.super_TPZVec<double>.fStore = local_148.fData.fExtAlloc;
  local_148.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01877af0;
  local_148.fData.super_TPZVec<double>.fNElements = 6;
  local_148.fData.super_TPZVec<double>.fNAlloc = 0;
  local_148.fData.fExtAlloc[0] = 0.0;
  local_148.fData.fExtAlloc[1] = 0.0;
  local_148.fData.fExtAlloc[2] = 0.0;
  local_148.fData.fExtAlloc[3] = 0.0;
  local_148.fData.fExtAlloc[4] = 0.0;
  local_148.fData.fExtAlloc[5] = 0.0;
  TPZTensor<double>::dJ2(this,&local_1f8);
  TPZTensor<double>::dJ3(this,&local_f0);
  Lodeangle(this,&local_148,&local_268);
  dVar7 = cos(local_268);
  local_228._8_4_ = extraout_XMM0_Dc_01;
  local_228._0_8_ = dVar7;
  local_228._12_4_ = extraout_XMM0_Dd_01;
  dVar7 = cos(local_268 + -2.0943951023931953);
  local_238._8_4_ = extraout_XMM0_Dc_02;
  local_238._0_8_ = dVar7;
  local_238._12_4_ = extraout_XMM0_Dd_02;
  dVar7 = cos(local_268 + 2.0943951023931953);
  local_248._8_4_ = extraout_XMM0_Dc_03;
  local_248._0_8_ = dVar7;
  local_248._12_4_ = extraout_XMM0_Dd_03;
  if (local_268 < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_7a634e,0x59);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZTensor.h"
               ,0x6ea);
  }
  if (1.0471975511965976 < local_268) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_7a637c,0x59);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZTensor.h"
               ,0x6ee);
  }
  uStack_250 = ~(local_208._8_8_ & 0x7fffffffffffffff) & local_208._8_8_;
  dVar13 = local_258 / 3.0;
  local_258 = (double)(~-(ulong)(ABS((double)local_208._0_8_) < 1e-06) &
                       (ulong)((double)local_208._0_8_ * 1.1547005383792517) |
                      -(ulong)(ABS((double)local_208._0_8_) < 1e-06) & 0x3eb35f66ab25e8b0);
  local_228._0_8_ = (double)local_228._0_8_ * local_258;
  local_238._0_8_ = (double)local_238._0_8_ * local_258;
  pdVar1 = (local_260->fData).super_TPZVec<double>.fStore;
  *pdVar1 = dVar13 + (double)local_228._0_8_;
  pdVar1[3] = dVar13 + (double)local_238._0_8_;
  local_248._0_8_ = dVar7 * local_258;
  pdVar1[5] = dVar13 + dVar7 * local_258;
  auVar2._8_4_ = SUB84(pdVar1[2] * 0.0,0);
  auVar2._0_8_ = pdVar1[1] * 0.0;
  auVar2._12_4_ = (int)((ulong)(pdVar1[2] * 0.0) >> 0x20);
  *(undefined1 (*) [16])(pdVar1 + 1) = auVar2;
  pdVar1[4] = pdVar1[4] * 0.0;
  local_1a0 = (_func_int **)&PTR__TPZTensor_01877730;
  TPZVec<double>::TPZVec(&local_198,0);
  local_260 = (TPZTensor<double> *)(0.5 / local_98);
  local_198._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01877af0;
  local_198.fNElements = 6;
  local_198.fNAlloc = 0;
  local_178[0] = (_func_int **)0x3ff0000000000000;
  local_178[5] = (_func_int **)0x3ff0000000000000;
  local_178[3] = (_func_int **)0x3ff0000000000000;
  local_178[4] = (_func_int **)0x0;
  local_178[1] = (_func_int **)0x0;
  local_178[2] = (_func_int **)0x0;
  lVar10 = 5;
  do {
    pp_Var8 = (&local_198._vptr_TPZVec)[lVar10];
    (&local_1a0)[lVar10] = (_func_int **)((double)(&local_1a0)[lVar10] * 0.3333333333333333);
    (&local_198._vptr_TPZVec)[lVar10] = (_func_int **)((double)pp_Var8 * 0.3333333333333333);
    lVar10 = lVar10 + 2;
  } while (lVar10 != 0xb);
  local_198.fStore = (double *)local_178;
  TPZManVector<double,_6>::operator=(&dSigma1->fData,&local_1f8.fData);
  uVar11 = local_238._12_4_;
  local_238._8_4_ = local_238._8_4_;
  local_238._0_8_ = local_238._0_8_ * (double)local_260;
  local_238._12_4_ = uVar11;
  uVar11 = local_248._12_4_;
  local_248._8_4_ = local_248._8_4_;
  local_248._0_8_ = local_248._0_8_ * (double)local_260;
  local_248._12_4_ = uVar11;
  pdVar1 = (dSigma1->fData).super_TPZVec<double>.fStore;
  lVar10 = 0;
  do {
    dVar7 = (pdVar1 + lVar10)[1] * (double)local_228._0_8_ * (double)local_260;
    auVar3._8_4_ = SUB84(dVar7,0);
    auVar3._0_8_ = pdVar1[lVar10] * (double)local_228._0_8_ * (double)local_260;
    auVar3._12_4_ = (int)((ulong)dVar7 >> 0x20);
    *(undefined1 (*) [16])(pdVar1 + lVar10) = auVar3;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 6);
  lVar10 = 0;
  do {
    pdVar1[lVar10] = (double)local_198.fStore[lVar10] + pdVar1[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  TPZTensor(&local_88,&local_148);
  dVar7 = sin(local_268);
  lVar10 = 0;
  do {
    dVar13 = (local_88.fData.super_TPZVec<double>.fStore + lVar10)[1];
    local_88.fData.super_TPZVec<double>.fStore[lVar10] =
         local_88.fData.super_TPZVec<double>.fStore[lVar10] * dVar7 * local_258;
    (local_88.fData.super_TPZVec<double>.fStore + lVar10)[1] = dVar13 * dVar7 * local_258;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 6);
  pdVar1 = (dSigma1->fData).super_TPZVec<double>.fStore;
  lVar10 = 0;
  do {
    pdVar1[lVar10] = pdVar1[lVar10] - local_88.fData.super_TPZVec<double>.fStore[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  TPZManVector<double,_6>::operator=(&dSigma2->fData,&local_1f8.fData);
  pTVar9 = local_210;
  pdVar1 = (dSigma2->fData).super_TPZVec<double>.fStore;
  lVar10 = 0;
  do {
    dVar7 = (pdVar1 + lVar10)[1] * (double)local_238._0_8_;
    auVar4._8_4_ = SUB84(dVar7,0);
    auVar4._0_8_ = pdVar1[lVar10] * (double)local_238._0_8_;
    auVar4._12_4_ = (int)((ulong)dVar7 >> 0x20);
    *(undefined1 (*) [16])(pdVar1 + lVar10) = auVar4;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 6);
  lVar10 = 0;
  do {
    pdVar1[lVar10] = (double)local_198.fStore[lVar10] + pdVar1[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  TPZManVector<double,_6>::operator=(&local_88.fData,&local_148.fData);
  dVar7 = sin(2.0943951023931953 - local_268);
  lVar10 = 0;
  do {
    dVar13 = (local_88.fData.super_TPZVec<double>.fStore + lVar10)[1];
    local_88.fData.super_TPZVec<double>.fStore[lVar10] =
         local_88.fData.super_TPZVec<double>.fStore[lVar10] * dVar7 * local_258;
    (local_88.fData.super_TPZVec<double>.fStore + lVar10)[1] = dVar13 * dVar7 * local_258;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 6);
  pdVar1 = (dSigma2->fData).super_TPZVec<double>.fStore;
  lVar10 = 0;
  do {
    pdVar1[lVar10] = local_88.fData.super_TPZVec<double>.fStore[lVar10] + pdVar1[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  TPZManVector<double,_6>::operator=(&pTVar9->fData,&local_1f8.fData);
  pdVar1 = (pTVar9->fData).super_TPZVec<double>.fStore;
  lVar10 = 0;
  do {
    dVar7 = (pdVar1 + lVar10)[1] * (double)local_248._0_8_;
    auVar5._8_4_ = SUB84(dVar7,0);
    auVar5._0_8_ = pdVar1[lVar10] * (double)local_248._0_8_;
    auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
    *(undefined1 (*) [16])(pdVar1 + lVar10) = auVar5;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 6);
  lVar10 = 0;
  do {
    pdVar1[lVar10] = (double)local_198.fStore[lVar10] + pdVar1[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  TPZManVector<double,_6>::operator=(&local_88.fData,&local_148.fData);
  dVar7 = sin(local_268 + 2.0943951023931953);
  lVar10 = 0;
  do {
    dVar13 = (local_88.fData.super_TPZVec<double>.fStore + lVar10)[1] * local_258 * dVar7;
    auVar6._8_4_ = SUB84(dVar13,0);
    auVar6._0_8_ = local_88.fData.super_TPZVec<double>.fStore[lVar10] * local_258 * dVar7;
    auVar6._12_4_ = (int)((ulong)dVar13 >> 0x20);
    *(undefined1 (*) [16])(local_88.fData.super_TPZVec<double>.fStore + lVar10) = auVar6;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 6);
  pdVar1 = (pTVar9->fData).super_TPZVec<double>.fStore;
  lVar10 = 0;
  do {
    pdVar1[lVar10] = pdVar1[lVar10] - local_88.fData.super_TPZVec<double>.fStore[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  local_88.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
  if (local_88.fData.super_TPZVec<double>.fStore != local_88.fData.fExtAlloc) {
    local_88.fData.super_TPZVec<double>.fNAlloc = 0;
    local_88.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    operator_delete__(local_88.fData.super_TPZVec<double>.fStore);
  }
  local_1a0 = (_func_int **)&PTR__TPZTensor_01877730;
  if ((_func_int ***)local_198.fStore != local_178) {
    local_198.fNAlloc = 0;
    local_198._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if ((_func_int ***)local_198.fStore != (_func_int ***)0x0) {
      operator_delete__(local_198.fStore);
    }
  }
  local_148.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
  if (local_148.fData.super_TPZVec<double>.fStore != local_148.fData.fExtAlloc) {
    local_148.fData.super_TPZVec<double>.fNAlloc = 0;
    local_148.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_148.fData.super_TPZVec<double>.fStore != (double *)0x0) {
      operator_delete__(local_148.fData.super_TPZVec<double>.fStore);
    }
  }
  local_f0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
  if (local_f0.fData.super_TPZVec<double>.fStore != local_f0.fData.fExtAlloc) {
    local_f0.fData.super_TPZVec<double>.fNAlloc = 0;
    local_f0.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_f0.fData.super_TPZVec<double>.fStore != (double *)0x0) {
      operator_delete__(local_f0.fData.super_TPZVec<double>.fStore);
    }
  }
  local_1f8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
  if (local_1f8.fData.super_TPZVec<double>.fStore != local_1f8.fData.fExtAlloc) {
    local_1f8.fData.super_TPZVec<double>.fNAlloc = 0;
    local_1f8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_1f8.fData.super_TPZVec<double>.fStore != (double *)0x0) {
      operator_delete__(local_1f8.fData.super_TPZVec<double>.fStore);
    }
  }
  return;
}

Assistant:

void TPZTensor<T>::Eigenvalue(TPZTensor<T> &eigenval, TPZTensor<T> &dSigma1, TPZTensor<T> &dSigma2, TPZTensor<T> &dSigma3)const {
    T I1(this->I1()), J2(this->J2());
    //	T J3(this->J3());

    if (fabs(TPZExtractVal::val(J2)) < 1.e-6)J2 = 1.e-6;
    //	if(fabs( TPZExtractVal::val(J2) ) < 1.e-6)return;

    T sqrtJ2 = sqrt(J2);
    if (fabs(TPZExtractVal::val(sqrtJ2)) < 1.e-6)sqrtJ2 = 1.e-6;

    TPZTensor<T> dJ2, dJ3, dLode;
    T Lode;

    this->dJ2(dJ2);
    this->dJ3(dJ3);
    this->Lodeangle(dLode, Lode);

    T pi23 = T(2. * M_PI / 3.);
    T TwoOverSqrThree = T(2. / sqrt(3.));
    T TwoOverSqrThreeJ2 = TwoOverSqrThree * sqrtJ2;
    T I13 = I1 / T(3.);

    T tempCosLode = cos(Lode) * TwoOverSqrThreeJ2;
    T tempCosMinusLode = cos(Lode - pi23) * TwoOverSqrThreeJ2;
    T tempCosPlusLode = cos(Lode + pi23) * TwoOverSqrThreeJ2;

    if (TPZExtractVal::val(Lode) < 0.) {
        std::cout << "Lode angle é Menor que ZERO. Valido somente para sig1 > sig2 > sig3 -> 0 < theta < Pi/3 " << std::endl;
        DebugStop();
    }
    if (TPZExtractVal::val(Lode) > M_PI / 3.) {
        std::cout << "Lode angle é Maior que Pi/3. Valido somente para sig1 > sig2 > sig3 -> 0 < theta < Pi/3 " << std::endl;
        DebugStop();
    }

    /*ORIGINAL*/
    //Valido somente para sig1 > sig2 > sig3 -> 0 < theta < Pi/3

    eigenval.XX() = I13 + tempCosLode;
    eigenval.YY() = I13 + tempCosMinusLode;
    eigenval.ZZ() = I13 + tempCosPlusLode;
    eigenval.XY() *= T(0.);
    eigenval.XZ() *= T(0.);
    eigenval.YZ() *= T(0.);




#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "\n  TPZTENSOR";
        sout << "\n  LodeAngle = \n" << Lode;
        sout << "\n  dLodeAngle= " << dLode;
        sout << "\n";
        LOGPZ_INFO(loggerr, sout.str());
    }
#endif



    T OneOverTwoJ2 = T(0.5) / J2;
    TPZTensor<T> dI13;
    dI13.Identity();
    dI13 *= T(1. / 3.);

    tempCosLode *= OneOverTwoJ2;
    tempCosMinusLode *= OneOverTwoJ2;
    tempCosPlusLode *= OneOverTwoJ2;

    dSigma1 = dJ2;
    dSigma1 *= tempCosLode;
    dSigma1 += dI13;
    TPZTensor<T> dLodeAngleTemp(dLode);
    dLodeAngleTemp *= sin(Lode) * TwoOverSqrThreeJ2;
    dSigma1 -= dLodeAngleTemp;

    dSigma2 = dJ2;
    dSigma2 *= tempCosMinusLode;
    dSigma2 += dI13;
    dLodeAngleTemp = dLode;
    dLodeAngleTemp *= sin(pi23 - Lode) * TwoOverSqrThreeJ2;
    dSigma2 += dLodeAngleTemp;

    dSigma3 = dJ2;
    dSigma3 *= tempCosPlusLode;
    dSigma3 += dI13;
    dLodeAngleTemp = dLode;
    dLodeAngleTemp *= sin(pi23 + Lode) * TwoOverSqrThreeJ2;
    dSigma3 -= dLodeAngleTemp;
}